

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryFunctions.cpp
# Opt level: O0

bool helics::waitForInit(Federate *fed,string_view fedName,milliseconds timeout)

{
  string_view queryStr;
  string_view queryStr_00;
  undefined1 uVar1;
  bool bVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  Federate *in_RSI;
  duration<long,_std::ratio<1L,_1000L>_> *in_RDI;
  string_view in_stack_00000000;
  HelicsSequencingModes in_stack_00000020;
  milliseconds delta;
  milliseconds waitTime;
  string res;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffefc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  strong_ordering in_stack_ffffffffffffff0f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff10;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  __unspec local_ca;
  type local_c9;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff40;
  basic_string_view<char,_std::char_traits<char>_> local_a8 [2];
  undefined4 local_88;
  undefined8 local_78;
  undefined1 local_70 [72];
  duration<long,_std::ratio<1L,_1000L>_> *local_28;
  Federate *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar6;
  
  local_28 = in_RDI;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff10,
             (char *)CONCAT17(in_stack_ffffffffffffff0f._M_value,in_stack_ffffffffffffff08));
  uVar4 = 1;
  queryStr._M_str._0_7_ = in_stack_fffffffffffffff8;
  queryStr._M_len = (size_t)in_RDX;
  queryStr._M_str._7_1_ = in_stack_ffffffffffffffff;
  Federate::query_abi_cxx11_(in_RSI,in_stack_00000000,queryStr,in_stack_00000020);
  memset(local_70,0,8);
  local_78 = 400;
  while( true ) {
    uVar1 = std::operator==(in_stack_ffffffffffffff00,
                            (char *)CONCAT44(in_stack_fffffffffffffefc,uVar4));
    if (((uVar1 ^ 0xff) & 1) == 0) {
      bVar6 = 1;
      goto LAB_003426c7;
    }
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffff20),(char *)in_stack_ffffffffffffff18,
                       (size_type)in_stack_ffffffffffffff10);
    if (sVar3 != 0xffffffffffffffff) break;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff18 = local_28;
    this = in_RSI;
    pbVar5 = in_RDX;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff10,
               (char *)CONCAT17(in_stack_ffffffffffffff0f._M_value,in_stack_ffffffffffffff08));
    uVar4 = 1;
    queryStr_00._M_str._0_7_ = in_stack_fffffffffffffff8;
    queryStr_00._M_len = (size_t)pbVar5;
    queryStr_00._M_str._7_1_ = in_stack_ffffffffffffffff;
    Federate::query_abi_cxx11_(this,in_stack_00000000,queryStr_00,in_stack_00000020);
    in_stack_ffffffffffffff10 = local_a8;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
    std::__cxx11::string::~string(in_stack_ffffffffffffff00);
    std::chrono::duration<long,_std::ratio<1L,_1000L>_>::operator+=
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff00,
               (duration<long,_std::ratio<1L,_1000L>_> *)CONCAT44(in_stack_fffffffffffffefc,uVar4));
    in_stack_ffffffffffffff0f =
         std::chrono::operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                   (in_RDI,(duration<long,_std::ratio<1L,_1000L>_> *)
                           CONCAT17(uVar1,in_stack_ffffffffffffff20));
    local_c9 = in_stack_ffffffffffffff0f._M_value;
    CLI::std::__cmp_cat::__unspec::__unspec(&local_ca,(__unspec *)0x0);
    bVar2 = std::operator>=(local_c9);
    in_RSI = this;
    in_RDX = pbVar5;
    if (bVar2) {
      bVar6 = 0;
LAB_003426c7:
      local_88 = 1;
      std::__cxx11::string::~string(in_stack_ffffffffffffff00);
      return (bool)(bVar6 & 1);
    }
  }
  bVar6 = 0;
  goto LAB_003426c7;
}

Assistant:

bool waitForInit(helics::Federate* fed, std::string_view fedName, std::chrono::milliseconds timeout)
{
    auto res = fed->query(fedName, "isinit", HELICS_SEQUENCING_MODE_ORDERED);
    std::chrono::milliseconds waitTime{0};
    const std::chrono::milliseconds delta{400};
    while (res != "true") {
        if (res.find("error") != std::string::npos) {
            return false;
        }
        std::this_thread::sleep_for(delta);
        res = fed->query(fedName, "isinit", HELICS_SEQUENCING_MODE_ORDERED);
        waitTime += delta;
        if (waitTime >= timeout) {
            return false;
        }
    }
    return true;
}